

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void __thiscall
TPZFrontNonSym<std::complex<long_double>_>::DecomposeEquations
          (TPZFrontNonSym<std::complex<long_double>_> *this,int64_t mineq,int64_t maxeq,
          TPZEqnArray<std::complex<long_double>_> *eqnarray)

{
  TPZEqnArray<std::complex<long_double>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  TPZEqnArray<std::complex<long_double>_> *in_RDI;
  int64_t ieq;
  int64_t in_stack_ffffffffffffffc8;
  undefined8 local_28;
  
  TPZEqnArray<std::complex<long_double>_>::Reset(in_RDI);
  TPZEqnArray<std::complex<long_double>_>::SetNonSymmetric(in_RCX);
  for (local_28 = in_RSI; local_28 <= in_RDX; local_28 = local_28 + 1) {
    DecomposeOneEquation
              ((TPZFrontNonSym<std::complex<long_double>_> *)in_RDI,in_stack_ffffffffffffffc8,
               (TPZEqnArray<std::complex<long_double>_> *)0x1d23970);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::DecomposeEquations(int64_t mineq, int64_t maxeq, TPZEqnArray<TVar> & eqnarray){
	// message #1.1 to eqnarray:TPZEqnArray
	int64_t ieq;
	
	eqnarray.Reset();
	eqnarray.SetNonSymmetric();
	
	for (ieq = mineq; ieq <= maxeq; ieq++) {
		// message #1.2.1 to this:TPZFront
		this->DecomposeOneEquation(ieq, eqnarray);
		//			this->Print("Teste.txt",output);
	}
}